

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

VariableP<tcu::Vector<float,_4>_> __thiscall
vkt::shaderexecutor::variable<tcu::Vector<float,4>>(shaderexecutor *this,string *name)

{
  pointer pcVar1;
  Variable<tcu::Vector<float,_4>_> *ptr;
  SharedPtrStateBase *extraout_RDX;
  VariableP<tcu::Vector<float,_4>_> VVar2;
  
  ptr = (Variable<tcu::Vector<float,_4>_> *)operator_new(0x28);
  (ptr->super_Expr<tcu::Vector<float,_4>_>).super_ExprBase._vptr_ExprBase =
       (_func_int **)&PTR__Variable_00d076a8;
  (ptr->m_name)._M_dataplus._M_p = (pointer)&(ptr->m_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&ptr->m_name,pcVar1,pcVar1 + name->_M_string_length);
  VariableP<tcu::Vector<float,_4>_>::VariableP((VariableP<tcu::Vector<float,_4>_> *)this,ptr);
  VVar2.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_state =
       extraout_RDX;
  VVar2.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr =
       (Variable<tcu::Vector<float,_4>_> *)this;
  return (VariableP<tcu::Vector<float,_4>_>)
         VVar2.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>;
}

Assistant:

VariableP<T> variable (const string& name)
{
	return VariableP<T>(new Variable<T>(name));
}